

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

TypedExpectation<test_result_(const_wchar_t_*)> * __thiscall
testing::internal::MockSpec<test_result_(const_wchar_t_*)>::InternalExpectedAt
          (MockSpec<test_result_(const_wchar_t_*)> *this,char *file,int line,char *obj,char *call)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  TypedExpectation<test_result_(const_wchar_t_*)> *pTVar3;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string source_text;
  string local_d0;
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"EXPECT_CALL(","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_90);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  paVar1 = &local_d0.field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0.field_2._8_8_ = plVar2[3];
    local_d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_d0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  psVar5 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_b0.field_2._M_allocated_capacity = *psVar5;
    local_b0.field_2._8_8_ = plVar2[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar5;
    local_b0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_b0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  std::__cxx11::string::append((char *)&local_d0);
  LogWithLocation(kInfo,file,line,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  pTVar3 = FunctionMockerBase<test_result_(const_wchar_t_*)>::AddNewExpectation
                     (this->function_mocker_,file,line,&local_b0,&this->matchers_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return pTVar3;
}

Assistant:

internal::TypedExpectation<F>& InternalExpectedAt(
      const char* file, int line, const char* obj, const char* call) {
    const string source_text(string("EXPECT_CALL(") + obj + ", " + call + ")");
    LogWithLocation(internal::kInfo, file, line, source_text + " invoked");
    return function_mocker_->AddNewExpectation(
        file, line, source_text, matchers_);
  }